

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall
World::Command(World *this,string *command,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *arguments,Command_Source *from)

{
  System_Command_Source *this_00;
  string local_60;
  unique_ptr<System_Command_Source,_std::default_delete<System_Command_Source>_> local_30;
  unique_ptr<System_Command_Source,_std::default_delete<System_Command_Source>_> system_source;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  string *command_local;
  World *this_local;
  
  system_source._M_t.
  super___uniq_ptr_impl<System_Command_Source,_std::default_delete<System_Command_Source>_>._M_t.
  super__Tuple_impl<0UL,_System_Command_Source_*,_std::default_delete<System_Command_Source>_>.
  super__Head_base<0UL,_System_Command_Source_*,_false>._M_head_impl =
       (__uniq_ptr_data<System_Command_Source,_std::default_delete<System_Command_Source>,_true,_true>
        )(__uniq_ptr_data<System_Command_Source,_std::default_delete<System_Command_Source>,_true,_true>
          )from;
  std::unique_ptr<System_Command_Source,std::default_delete<System_Command_Source>>::
  unique_ptr<std::default_delete<System_Command_Source>,void>
            ((unique_ptr<System_Command_Source,std::default_delete<System_Command_Source>> *)
             &local_30);
  if ((__uniq_ptr_impl<System_Command_Source,_std::default_delete<System_Command_Source>_>)
      system_source._M_t.
      super___uniq_ptr_impl<System_Command_Source,_std::default_delete<System_Command_Source>_>._M_t
      .super__Tuple_impl<0UL,_System_Command_Source_*,_std::default_delete<System_Command_Source>_>.
      super__Head_base<0UL,_System_Command_Source_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<System_Command_Source,_std::default_delete<System_Command_Source>_>)0x0) {
    this_00 = (System_Command_Source *)operator_new(0x10);
    System_Command_Source::System_Command_Source(this_00,this);
    std::unique_ptr<System_Command_Source,_std::default_delete<System_Command_Source>_>::reset
              (&local_30,this_00);
    system_source._M_t.
    super___uniq_ptr_impl<System_Command_Source,_std::default_delete<System_Command_Source>_>._M_t.
    super__Tuple_impl<0UL,_System_Command_Source_*,_std::default_delete<System_Command_Source>_>.
    super__Head_base<0UL,_System_Command_Source_*,_false>._M_head_impl =
         (__uniq_ptr_data<System_Command_Source,_std::default_delete<System_Command_Source>,_true,_true>
          )std::unique_ptr<System_Command_Source,_std::default_delete<System_Command_Source>_>::get
                     (&local_30);
  }
  util::lowercase(&local_60,command);
  Commands::Handle(&local_60,arguments,
                   (Command_Source *)
                   system_source._M_t.
                   super___uniq_ptr_impl<System_Command_Source,_std::default_delete<System_Command_Source>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_System_Command_Source_*,_std::default_delete<System_Command_Source>_>
                   .super__Head_base<0UL,_System_Command_Source_*,_false>._M_head_impl);
  std::__cxx11::string::~string((string *)&local_60);
  std::unique_ptr<System_Command_Source,_std::default_delete<System_Command_Source>_>::~unique_ptr
            (&local_30);
  return;
}

Assistant:

void World::Command(std::string command, const std::vector<std::string>& arguments, Command_Source* from)
{
	std::unique_ptr<System_Command_Source> system_source;

	if (!from)
	{
		system_source.reset(new System_Command_Source(this));
		from = system_source.get();
	}

	Commands::Handle(util::lowercase(command), arguments, from);
}